

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

uchar * DecodeDataBase64(uchar *data,int *outputSize)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  uchar *puVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  ulong __size;
  
  uVar7 = 0;
  for (puVar5 = data + 3; puVar5[-3] != '\0'; puVar5 = puVar5 + 4) {
    iVar6 = 3;
    if (*puVar5 == '=') {
      iVar6 = (puVar5[-1] != '=') + 1;
    }
    uVar7 = uVar7 + iVar6;
  }
  __size = (ulong)uVar7;
  puVar5 = (uchar *)malloc(__size);
  uVar3 = (ulong)uVar7 / 3;
  pbVar9 = data + 3;
  for (lVar8 = 0; uVar3 * 3 != lVar8; lVar8 = lVar8 + 3) {
    bVar4 = ""[pbVar9[-2]];
    bVar1 = ""[pbVar9[-1]];
    bVar2 = *pbVar9;
    puVar5[lVar8] = bVar4 >> 4 | ""[pbVar9[-3]] << 2;
    bVar2 = ""[bVar2];
    puVar5[lVar8 + 1] = bVar1 >> 2 | bVar4 << 4;
    puVar5[lVar8 + 2] = bVar1 << 6 | bVar2;
    pbVar9 = pbVar9 + 4;
  }
  if (uVar7 % 3 == 1) {
    bVar4 = ""[data[(uVar3 & 0x3fffffff) * 4 + 1]] >> 4 | ""[data[uVar3 * 4]] << 2;
  }
  else {
    if (uVar7 % 3 != 2) goto LAB_00160dfe;
    lVar8 = (uVar3 & 0x3fffffff) * 4;
    bVar4 = ""[data[lVar8 + 1]];
    bVar1 = ""[data[lVar8 + 2]];
    puVar5[__size - 2] = bVar4 >> 4 | ""[data[uVar3 * 4]] << 2;
    bVar4 = bVar1 >> 2 | bVar4 << 4;
  }
  puVar5[__size - 1] = bVar4;
LAB_00160dfe:
  *outputSize = uVar7;
  return puVar5;
}

Assistant:

unsigned char *DecodeDataBase64(const unsigned char *data, int *outputSize)
{
    static const unsigned char base64decodeTable[] = {
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 62, 0, 0, 0, 63, 52, 53, 54, 55, 56, 57, 58, 59, 60, 61, 0, 0, 0, 0, 0, 0, 0, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10,
        11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 0, 0, 0, 0, 0, 0, 26, 27, 28, 29, 30, 31, 32, 33, 34, 35, 36,
        37, 38, 39, 40, 41, 42, 43, 44, 45, 46, 47, 48, 49, 50, 51
    };

    // Get output size of Base64 input data
    int outSize = 0;
    for (int i = 0; data[4*i] != 0; i++)
    {
        if (data[4*i + 3] == '=')
        {
            if (data[4*i + 2] == '=') outSize += 1;
            else outSize += 2;
        }
        else outSize += 3;
    }

    // Allocate memory to store decoded Base64 data
    unsigned char *decodedData = (unsigned char *)RL_MALLOC(outSize);

    for (int i = 0; i < outSize/3; i++)
    {
        unsigned char a = base64decodeTable[(int)data[4*i]];
        unsigned char b = base64decodeTable[(int)data[4*i + 1]];
        unsigned char c = base64decodeTable[(int)data[4*i + 2]];
        unsigned char d = base64decodeTable[(int)data[4*i + 3]];

        decodedData[3*i] = (a << 2) | (b >> 4);
        decodedData[3*i + 1] = (b << 4) | (c >> 2);
        decodedData[3*i + 2] = (c << 6) | d;
    }

    if (outSize%3 == 1)
    {
        int n = outSize/3;
        unsigned char a = base64decodeTable[(int)data[4*n]];
        unsigned char b = base64decodeTable[(int)data[4*n + 1]];
        decodedData[outSize - 1] = (a << 2) | (b >> 4);
    }
    else if (outSize%3 == 2)
    {
        int n = outSize/3;
        unsigned char a = base64decodeTable[(int)data[4*n]];
        unsigned char b = base64decodeTable[(int)data[4*n + 1]];
        unsigned char c = base64decodeTable[(int)data[4*n + 2]];
        decodedData[outSize - 2] = (a << 2) | (b >> 4);
        decodedData[outSize - 1] = (b << 4) | (c >> 2);
    }

    *outputSize = outSize;
    return decodedData;
}